

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

parasail_matrix_t * parasail_matrix_from_file_internal(char *filename,int case_sensitive)

{
  byte bVar1;
  char cVar2;
  ushort uVar3;
  ushort *puVar4;
  __int32_t *p_Var5;
  __int32_t *p_Var6;
  bool bVar7;
  int iVar8;
  parasail_file_t *pf;
  char *__s;
  size_t sVar9;
  ulong uVar10;
  int *b;
  size_t sVar11;
  __int32_t **pp_Var12;
  parasail_matrix_t *ppVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  size_t sVar17;
  char *pcVar18;
  long lVar19;
  int *__ptr;
  long lVar20;
  ushort **ppuVar21;
  bool bVar22;
  int val;
  char *local_a0;
  ulong local_90;
  int local_80;
  int local_7c;
  ulong local_78;
  int local_6c;
  size_t local_68;
  size_t local_60;
  ushort **local_58;
  long local_50;
  char *local_48;
  int local_40;
  char local_3a [10];
  
  if (filename == (char *)0x0) {
    parasail_matrix_from_file_internal_cold_10();
  }
  else {
    pf = parasail_open(filename);
    if (pf == (parasail_file_t *)0x0) {
      fprintf(_stderr,"parasail_matrix_from_file: parasail_open(%s) failed\n",filename);
    }
    else {
      local_50 = pf->size;
      local_48 = filename;
      local_40 = case_sensitive;
      if (local_50 < 1) {
        local_7c = 0x7fffffff;
        local_80 = -0x80000000;
        __s = (char *)0x0;
        local_a0 = (char *)0x0;
        local_90 = 0;
        local_60 = 0;
        sVar9 = 0;
        local_78 = 0;
        __ptr = (int *)0x0;
      }
      else {
        pcVar18 = pf->buf;
        bVar22 = true;
        local_80 = -0x80000000;
        local_7c = 0x7fffffff;
        __ptr = (int *)0x0;
        local_78 = 0;
        uVar10 = 0;
        sVar9 = 0;
        local_60 = 0;
        local_68 = 0;
        local_90 = 0;
        local_a0 = (char *)0x0;
        __s = (char *)0x0;
        lVar20 = 0;
        do {
          bVar1 = pcVar18[lVar20];
          uVar16 = (ulong)(char)bVar1;
          if (uVar16 == 0x23) {
            for (; (pcVar18[lVar20] != '\n' && (pcVar18[lVar20] != '\r')); lVar20 = lVar20 + 1) {
            }
            lVar14 = lVar20 + 1;
            if ((pcVar18[lVar20 + 1] == '\n') || (pcVar18[lVar20 + 1] == '\r')) {
LAB_004a02e4:
              lVar20 = lVar14;
            }
          }
          else {
            local_58 = __ctype_b_loc();
            sVar17 = local_60;
            uVar3 = (*local_58)[uVar16];
            if ((uVar3 & 8) == 0) {
              if (0x2d < bVar1) {
LAB_004a0975:
                if ((uVar3 >> 0xe & 1) == 0) {
                  pcVar18 = 
                  "parasail_matrix_from_file: non-printing character in matrix file (\'%d\')\n";
                }
                else {
                  pcVar18 = 
                  "parasail_matrix_from_file: non-alpha character in matrix file (\'%c\')\n";
                }
                fprintf(_stderr,pcVar18,uVar16 & 0xffffffff);
                if (__s != (char *)0x0) {
                  free(__s);
                }
                if (local_a0 != (char *)0x0) {
                  free(local_a0);
                }
                if (__ptr != (int *)0x0) {
                  free(__ptr);
                }
                parasail_close(pf);
                return (parasail_matrix_t *)0x0;
              }
              uVar15 = (ulong)bVar1;
              if ((0x2400UL >> (uVar15 & 0x3f) & 1) == 0) {
                if ((0x100000200U >> (uVar15 & 0x3f) & 1) == 0) {
                  if ((0x240000000000U >> (uVar15 & 0x3f) & 1) == 0) goto LAB_004a0975;
                  goto LAB_004a01f9;
                }
              }
              else {
                lVar14 = lVar20 + 1;
                if ((lVar14 < local_50) && ((pcVar18[lVar14] == '\r' || (pcVar18[lVar14] == '\n'))))
                goto LAB_004a02e4;
              }
            }
            else {
LAB_004a01f9:
              if (bVar22) {
                lVar19 = 0;
                lVar14 = lVar20;
                do {
                  bVar1 = pcVar18[lVar14];
                  uVar10 = (ulong)bVar1;
                  if (uVar10 < 0x24) {
                    if ((0x100000200U >> (uVar10 & 0x3f) & 1) == 0) {
                      if ((0x800002400U >> (uVar10 & 0x3f) & 1) == 0) goto LAB_004a0228;
                      break;
                    }
                  }
                  else {
LAB_004a0228:
                    if ((bVar1 != 0x2a) && (((*local_58)[(char)bVar1] & 0x400) == 0))
                    goto LAB_004a0619;
                    lVar19 = lVar19 + 1;
                  }
                  lVar14 = lVar14 + 1;
                } while (local_50 != lVar14);
                if (lVar19 == 0) {
LAB_004a0619:
                  __s = (char *)0x0;
                }
                else {
                  __s = (char *)malloc(lVar19 + 1);
                  if (__s == (char *)0x0) {
                    perror("malloc");
                    goto LAB_004a0619;
                  }
                  lVar19 = 0;
                  lVar14 = lVar20;
                  do {
                    bVar1 = pcVar18[lVar14];
                    uVar10 = (ulong)bVar1;
                    if (uVar10 < 0x24) {
                      if ((0x100000200U >> (uVar10 & 0x3f) & 1) == 0) {
                        if ((0x800002400U >> (uVar10 & 0x3f) & 1) == 0) goto LAB_004a0291;
                        break;
                      }
                    }
                    else {
LAB_004a0291:
                      if ((bVar1 != 0x2a) && (((*local_58)[(char)bVar1] & 0x400) == 0))
                      goto LAB_004a0619;
                      __s[lVar19] = bVar1;
                      lVar19 = lVar19 + 1;
                    }
                    lVar14 = lVar14 + 1;
                  } while (local_50 != lVar14);
                  __s[lVar19] = '\0';
                }
                if (__s == (char *)0x0) {
                  parasail_matrix_from_file_internal_cold_3();
                  return (parasail_matrix_t *)0x0;
                }
                sVar9 = strlen(__s);
                uVar10 = sVar9 * sVar9;
                __ptr = (int *)malloc(uVar10 * 4);
                if (__ptr == (int *)0x0) {
                  parasail_matrix_from_file_internal_cold_2();
                  return (parasail_matrix_t *)0x0;
                }
                local_68 = sVar9;
                local_a0 = (char *)malloc(sVar9 + 1);
                if (local_a0 == (char *)0x0) {
                  parasail_matrix_from_file_internal_cold_1();
                  return (parasail_matrix_t *)0x0;
                }
                for (; (pcVar18[lVar20] != '\n' && (pcVar18[lVar20] != '\r')); lVar20 = lVar20 + 1)
                {
                }
                bVar22 = false;
                sVar9 = local_68;
                if ((pcVar18[lVar20 + 1] == '\n') || (pcVar18[lVar20 + 1] == '\r')) {
                  lVar20 = lVar20 + 1;
                }
              }
              else {
                if (local_90 < local_68) {
LAB_004a032d:
                  cVar2 = pcVar18[lVar20];
                  if (((long)cVar2 == 0x2a) || (((*local_58)[cVar2] & 0x400) != 0)) {
                    local_a0[local_90] = cVar2;
                    lVar20 = lVar20 + 1;
                  }
                  else {
                    local_a0[local_90] = '*';
                  }
                  local_60 = sVar17 + 1;
                  local_90 = local_90 + 1;
                  if (sVar9 == 0) {
                    bVar7 = true;
                  }
                  else {
                    sVar17 = 0;
                    ppuVar21 = local_58;
                    do {
                      local_6c = 0;
                      lVar14 = lVar20;
                      do {
                        do {
                          lVar19 = lVar14 + 1;
                          cVar2 = pcVar18[lVar14];
                          lVar14 = lVar19;
                        } while (cVar2 == ' ');
                      } while (cVar2 == '\t');
                      puVar4 = *ppuVar21;
                      bVar22 = true;
                      if ((cVar2 == '-') || ((puVar4[cVar2] & 0x800) != 0)) {
                        uVar16 = 1;
                        do {
                          if ((*(byte *)((long)puVar4 + (long)pcVar18[lVar19] * 2 + 1) & 8) == 0)
                          goto LAB_004a0445;
                          local_3a[uVar16] = pcVar18[lVar19];
                          uVar16 = uVar16 + 1;
                          lVar19 = lVar19 + 1;
                        } while (uVar16 != 10);
                        uVar16 = 10;
LAB_004a0445:
                        local_3a[0] = cVar2;
                        if ((int)uVar16 != 10) {
                          local_3a[uVar16 & 0xffffffff] = '\0';
                          iVar8 = __isoc99_sscanf(local_3a,"%d",&local_6c);
                          bVar22 = iVar8 != 1;
                          ppuVar21 = local_58;
                          if (!bVar22) {
                            lVar20 = lVar19;
                          }
                        }
                      }
                      if (bVar22) {
                        fwrite("parasail_matrix_from_file: poorly formed matrix file\n",0x35,1,
                               _stderr);
                        if (__s != (char *)0x0) {
                          free(__s);
                        }
                        if (local_a0 != (char *)0x0) {
                          free(local_a0);
                        }
                        if (__ptr != (int *)0x0) {
                          free(__ptr);
                        }
                        parasail_close(pf);
                        bVar7 = false;
                      }
                      else {
                        uVar16 = uVar10;
                        if (uVar10 <= local_78) {
                          uVar16 = uVar10 * 2;
                          __ptr = (int *)realloc(__ptr,uVar10 << 3);
                          if (__ptr == (int *)0x0) {
                            perror("realloc");
                            fwrite("parasail_matrix_from_file: couldn\'t grow matrix size\n",0x35,1,
                                   _stderr);
                            if (__s != (char *)0x0) {
                              free(__s);
                            }
                            if (local_a0 != (char *)0x0) {
                              free(local_a0);
                            }
                            parasail_close(pf);
                            bVar7 = false;
                            __ptr = (int *)0x0;
                            uVar10 = uVar16;
                            goto LAB_004a04fa;
                          }
                        }
                        __ptr[local_78] = local_6c;
                        local_78 = local_78 + 1;
                        if (local_80 < local_6c) {
                          local_80 = local_6c;
                        }
                        if (local_6c < local_7c) {
                          local_7c = local_6c;
                        }
                        bVar7 = true;
                        uVar10 = uVar16;
                      }
LAB_004a04fa:
                    } while ((bVar7) && (sVar17 = sVar17 + 1, sVar17 != sVar9));
                  }
                }
                else {
                  lVar14 = local_68 * 2;
                  local_68 = local_68 * 2;
                  local_a0 = (char *)realloc(local_a0,lVar14 + 1);
                  if (local_a0 != (char *)0x0) goto LAB_004a032d;
                  parasail_matrix_from_file_internal_cold_4();
                  local_a0 = (char *)0x0;
                  bVar7 = false;
                }
                bVar22 = false;
                if (!bVar7) {
                  return (parasail_matrix_t *)0x0;
                }
              }
            }
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 < local_50);
      }
      parasail_close(pf);
      local_a0[local_90] = '\0';
      if ((sVar9 == local_90) && (iVar8 = strcmp(__s,local_a0), iVar8 == 0)) {
        if (local_78 != sVar9 * sVar9) {
          parasail_matrix_from_file_internal_cold_6();
          return (parasail_matrix_t *)0x0;
        }
        iVar8 = 0;
        if (local_60 != sVar9) {
          parasail_matrix_from_file_internal_cold_7();
          return (parasail_matrix_t *)0x0;
        }
      }
      else {
        iVar8 = 1;
        if (local_78 != sVar9 * local_60) {
          parasail_matrix_from_file_internal_cold_5();
          return (parasail_matrix_t *)0x0;
        }
      }
      sVar17 = local_60;
      b = (int *)malloc(0x400);
      if (b == (int *)0x0) {
        parasail_matrix_from_file_internal_cold_9();
      }
      else {
        parasail_memset_int(b,(int)sVar9 + -1,0x100);
        if (local_40 == 0) {
          if (sVar9 != 0) {
            pp_Var12 = __ctype_toupper_loc();
            p_Var5 = *pp_Var12;
            pp_Var12 = __ctype_tolower_loc();
            p_Var6 = *pp_Var12;
            sVar11 = 0;
            do {
              b[p_Var5[(byte)__s[sVar11]]] = (int)sVar11;
              b[p_Var6[(byte)__s[sVar11]]] = (int)sVar11;
              sVar11 = sVar11 + 1;
            } while (sVar9 != sVar11);
          }
        }
        else if (sVar9 != 0) {
          sVar11 = 0;
          do {
            b[(byte)__s[sVar11]] = (int)sVar11;
            sVar11 = sVar11 + 1;
          } while (sVar9 != sVar11);
        }
        ppVar13 = (parasail_matrix_t *)malloc(0x48);
        if (ppVar13 != (parasail_matrix_t *)0x0) {
          ppVar13->name = local_48;
          ppVar13->matrix = __ptr;
          ppVar13->mapper = b;
          ppVar13->size = (int)sVar9;
          ppVar13->max = local_80;
          ppVar13->min = local_7c;
          ppVar13->user_matrix = __ptr;
          ppVar13->type = iVar8;
          ppVar13->length = (int)sVar17;
          ppVar13->alphabet = __s;
          ppVar13->query = local_a0;
          return ppVar13;
        }
        parasail_matrix_from_file_internal_cold_8();
      }
    }
  }
  return (parasail_matrix_t *)0x0;
}

Assistant:

static parasail_matrix_t* parasail_matrix_from_file_internal(const char *filename, int case_sensitive)
{
    parasail_matrix_t *retval = NULL;
    int *matrix = NULL;
    size_t matrix_i = 0;
    size_t matrix_capacity = 0;
    int *mapper = NULL;
    char *alphabet = NULL;
    char *alphabet_query = NULL;
    size_t alphabet_query_i = 0;
    size_t alphabet_query_capacity = 0;
    parasail_file_t *pf = NULL;
    const char *T = NULL;
    off_t i = 0;
    off_t size = 0;
    int first_alpha = 1;
    size_t count = 0;
    size_t asize = 0;
    int max = INT_MIN;
    int min = INT_MAX;
    size_t c = 0;
    int type = PARASAIL_MATRIX_TYPE_SQUARE;

    if (NULL == filename) {
        fprintf(stderr, "parasail_matrix_from_file: NULL pointer\n");
        return NULL;
    }

    pf = parasail_open(filename);
    if (NULL == pf) {
        fprintf(stderr, "parasail_matrix_from_file: "
                "parasail_open(%s) failed\n", filename);
        return NULL;
    }
    T = pf->buf;
    size = pf->size;

    while (i<size) {
        if (T[i] == '#') {
            /* ignore comments */
            i = skip_line(T, i);
        }
        else if (isalnum(T[i]) || T[i] == '*' || T[i] == '-') {
            if (first_alpha) {
                first_alpha = 0;
                alphabet = get_alphabet(T, i, size);
                if (NULL == alphabet) {
                    fprintf(stderr, "parasail_matrix_from_file: "
                            "poorly formed matrix file alphabet\n");
                    parasail_close(pf);
                    return NULL;
                }
                asize = strlen(alphabet);
                matrix_capacity = asize*asize;
                matrix = (int*)malloc(sizeof(int)*matrix_capacity);
                if (NULL == matrix) {
                    perror("malloc");
                    fprintf(stderr, "parasail_matrix_from_file: "
                            "cannont malloc buffer for matrix\n");
                    free(alphabet);
                    parasail_close(pf);
                    return NULL;
                }
                alphabet_query_capacity = asize;
                alphabet_query = (char*)malloc(sizeof(char)*(alphabet_query_capacity+1));
                if (NULL == alphabet_query) {
                    perror("malloc");
                    fprintf(stderr, "parasail_matrix_from_file: "
                            "cannont malloc buffer for matrix alphabet\n");
                    free(matrix);
                    free(alphabet);
                    parasail_close(pf);
                    return NULL;
                }
                i = skip_line(T, i);
            }
            else {
                size_t j=0;
                /* store the letter */
                if (alphabet_query_i >= alphabet_query_capacity) {
                    alphabet_query_capacity *= 2;
                    alphabet_query = realloc(alphabet_query, sizeof(char)*(alphabet_query_capacity+1));
                    if (NULL == alphabet_query) {
                        perror("realloc");
                        fprintf(stderr, "parasail_matrix_from_file: "
                                "couldn't grow query size\n");
                        if (alphabet) free(alphabet);
                        if (alphabet_query) free(alphabet_query);
                        if (matrix) free(matrix);
                        parasail_close(pf);
                        return NULL;
                    }
                }
                ++count;
                /* allow PSSM matrix to omit query */
                if (isalpha(T[i]) || T[i] == '*') {
                    alphabet_query[alphabet_query_i++] = T[i];
                    ++i; /* skip over the letter */
                }
                else {
                    alphabet_query[alphabet_query_i++] = '*';
                    /* don't increment read index i */
                }
                for (j=0; j<asize; ++j) {
                    int val = 0;
                    int retcode = get_num(T, &i, &val);
                    if (-1 == retcode) {
                        fprintf(stderr, "parasail_matrix_from_file: "
                                "poorly formed matrix file\n");
                        if (alphabet) free(alphabet);
                        if (alphabet_query) free(alphabet_query);
                        if (matrix) free(matrix);
                        parasail_close(pf);
                        return NULL;
                    }
                    if (matrix_i >= matrix_capacity) {
                        matrix_capacity *= 2;
                        matrix = realloc(matrix, sizeof(int)*matrix_capacity);
                        if (NULL == matrix) {
                            perror("realloc");
                            fprintf(stderr, "parasail_matrix_from_file: "
                                    "couldn't grow matrix size\n");
                            if (alphabet) free(alphabet);
                            if (alphabet_query) free(alphabet_query);
                            if (matrix) free(matrix);
                            parasail_close(pf);
                            return NULL;
                        }
                    }
                    matrix[matrix_i++] = val;
                    max = val > max ? val : max;
                    min = val < min ? val : min;
                }
            }
        }
        else if (T[i] == '\n' || T[i] == '\r') {
            /* ignore newline */
            /* for the case of "\r\n" or "\n\r" */
            if (i+1<size && (T[i+1] == '\n' || T[i+1] == '\r')) {
                ++i;
            }
        }
        else if (T[i] == ' ' || T[i] == '\t') {
            /* ignore spaces and tabs */
        }
        else if (isprint(T[i])) {
            fprintf(stderr, "parasail_matrix_from_file: "
                    "non-alpha character in matrix file ('%c')\n", T[i]);
            if (alphabet) free(alphabet);
            if (alphabet_query) free(alphabet_query);
            if (matrix) free(matrix);
            parasail_close(pf);
            return NULL;
        }
        else {
            fprintf(stderr, "parasail_matrix_from_file: "
                    "non-printing character in matrix file ('%d')\n", T[i]);
            if (alphabet) free(alphabet);
            if (alphabet_query) free(alphabet_query);
            if (matrix) free(matrix);
            parasail_close(pf);
            return NULL;
        }
        ++i;
    }

    parasail_close(pf);

    /* we consider this a square matrix if alphabet sizes match and are identical */
    alphabet_query[alphabet_query_i] = '\0';
    if (asize == alphabet_query_i && 0 == strcmp(alphabet, alphabet_query)) {
        /* square */
        if (matrix_i != asize*asize) {
            fprintf(stderr, "parasail_matrix_from_file: "
                    "matrix is missing values\n");
            free(alphabet);
            free(alphabet_query);
            free(matrix);
            return NULL;
        }
        if (count != asize) {
            fprintf(stderr, "parasail_matrix_from_file: "
                    "matrix is missing rows\n");
            free(alphabet);
            free(alphabet_query);
            free(matrix);
            return NULL;
        }
    }
    else {
        /* PSSM */
        type = PARASAIL_MATRIX_TYPE_PSSM;
        if (matrix_i != asize*count) {
            fprintf(stderr, "parasail_matrix_from_file: "
                    "matrix is missing values\n");
            free(alphabet);
            free(alphabet_query);
            free(matrix);
            return NULL;
        }
    }

    mapper = (int*)malloc(sizeof(int)*256);
    if (NULL == mapper) {
        perror("malloc");
        fprintf(stderr, "parasail_matrix_from_file: "
                "cannont malloc mapper buffer for matrix file `%s'\n",
                filename);
        free(alphabet);
        free(alphabet_query);
        free(matrix);
        return NULL;
    }
    parasail_memset_int(mapper, asize-1, 256);
    if (case_sensitive) {
        for (c=0; c<asize; ++c) {
            mapper[(unsigned char)alphabet[c]] = (int)c;
        }
    }
    else {
        for (c=0; c<asize; ++c) {
            mapper[toupper((unsigned char)alphabet[c])] = (int)c;
            mapper[tolower((unsigned char)alphabet[c])] = (int)c;
        }
    }

    retval = (parasail_matrix_t*)malloc(sizeof(parasail_matrix_t));
    if (NULL == retval) {
        perror("malloc");
        fprintf(stderr, "parasail_matrix_from_file: "
                "cannont malloc buffer for matrix file `%s'\n", filename);
        free(matrix);
        return NULL;
    }

    retval->name = filename;
    retval->matrix = matrix;
    retval->mapper = mapper;
    retval->size = (int)asize;
    retval->max = max;
    retval->min = min;
    retval->user_matrix = matrix;
    retval->type = type;
    retval->length = (int)count;
    retval->alphabet = alphabet;
    retval->query = alphabet_query;
    return retval;
}